

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capture_exception.cpp
# Opt level: O1

bool get_harmonic_mean_safe(double a,double b,double *c)

{
  ostream *poVar1;
  double dVar2;
  
  dVar2 = -b;
  if ((dVar2 != a) || (NAN(dVar2) || NAN(a))) {
    *c = ((a + a) * b) / (b + a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"result = ",9);
    poVar1 = std::ostream::_M_insert<double>(*c);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return (bool)(-(a != dVar2) & 1);
}

Assistant:

bool get_harmonic_mean_safe(double a, double b, double * c) {
    if (a == -b) {
        return false;
    }

    //  pass function result via pointer param...
    *c = 2.0 * a * b / (a + b);
    std::cout << "result = " << *c << std::endl;
    return true;
}